

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&>
* __thiscall
Catch::ExprLhs<std::__cxx11::wstring_const&>::operator==
          (BinaryExpr<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_const_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_&>
           *__return_storage_ptr__,ExprLhs<std::__cxx11::wstring_const&> *this,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *rhs)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = compareEqual<std::__cxx11::wstring,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                    (*(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> **
                      )this,rhs);
  pbVar1 = *(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0019aba8;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }